

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O0

Greetable *
greetable_proxy_new_for_bus_sync
          (GBusType bus_type,GDBusProxyFlags flags,gchar *name,gchar *object_path,
          GCancellable *cancellable,GError **error)

{
  GType GVar1;
  long lVar2;
  GInitable *ret;
  GError **error_local;
  GCancellable *cancellable_local;
  gchar *object_path_local;
  gchar *name_local;
  GDBusProxyFlags flags_local;
  GBusType bus_type_local;
  
  GVar1 = greetable_proxy_get_type();
  lVar2 = g_initable_new(GVar1,cancellable,error,"g-flags",flags,"g-name",name,"g-bus-type",bus_type
                         ,"g-object-path",object_path,"g-interface-name",
                         "io.mangoh.Testing.Greetable",0);
  if (lVar2 == 0) {
    _flags_local = (Greetable *)0x0;
  }
  else {
    GVar1 = greetable_get_type();
    _flags_local = (Greetable *)g_type_check_instance_cast(lVar2,GVar1);
  }
  return _flags_local;
}

Assistant:

Greetable *
greetable_proxy_new_for_bus_sync (
    GBusType             bus_type,
    GDBusProxyFlags      flags,
    const gchar         *name,
    const gchar         *object_path,
    GCancellable        *cancellable,
    GError             **error)
{
  GInitable *ret;
  ret = g_initable_new (TYPE_GREETABLE_PROXY, cancellable, error, "g-flags", flags, "g-name", name, "g-bus-type", bus_type, "g-object-path", object_path, "g-interface-name", "io.mangoh.Testing.Greetable", NULL);
  if (ret != NULL)
    return GREETABLE (ret);
  else
    return NULL;
}